

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void unparsedEntityDeclDebug
               (void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId,xmlChar *notationName)

{
  xmlChar *nullstr;
  xmlChar *notationName_local;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  xmlChar *name_local;
  void *ctx_local;
  
  systemId_local = publicId;
  if (publicId == (xmlChar *)0x0) {
    systemId_local = "(null)";
  }
  notationName_local = systemId;
  if (systemId == (xmlChar *)0x0) {
    notationName_local = "(null)";
  }
  nullstr = notationName;
  if (notationName == (xmlChar *)0x0) {
    nullstr = "(null)";
  }
  callbacks = callbacks + 1;
  if (quiet == 0) {
    fprintf((FILE *)SAXdebug,"SAX.unparsedEntityDecl(%s, %s, %s, %s)\n",name,systemId_local,
            notationName_local,nullstr);
  }
  return;
}

Assistant:

static void
unparsedEntityDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name,
		   const xmlChar *publicId, const xmlChar *systemId,
		   const xmlChar *notationName)
{
const xmlChar *nullstr = BAD_CAST "(null)";

    if (publicId == NULL)
        publicId = nullstr;
    if (systemId == NULL)
        systemId = nullstr;
    if (notationName == NULL)
        notationName = nullstr;
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.unparsedEntityDecl(%s, %s, %s, %s)\n",
            (char *) name, (char *) publicId, (char *) systemId,
	    (char *) notationName);
}